

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# req.c
# Opt level: O0

void nn_req_handler(nn_fsm *self,int src,int type,void *srcptr)

{
  uint in_EDX;
  uint in_ESI;
  long in_RDI;
  int in_stack_0000000c;
  nn_req *in_stack_00000010;
  nn_req *req;
  long local_28;
  
  if (in_RDI == 0) {
    local_28 = 0;
  }
  else {
    local_28 = in_RDI + -800;
  }
  switch(*(undefined4 *)(local_28 + 0x378)) {
  case 1:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x172);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_28 + 0x378),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x16e);
      fflush(_stderr);
      nn_err_abort();
    }
    *(undefined4 *)(local_28 + 0x378) = 2;
    break;
  case 2:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x186);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_28 + 0x378),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x182);
      fflush(_stderr);
      nn_err_abort();
    }
    nn_req_action_send(in_stack_00000010,in_stack_0000000c);
    break;
  case 3:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x19e);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 3) {
      nn_req_action_send(in_stack_00000010,in_stack_0000000c);
    }
    else if (in_EDX != 4) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
              (ulong)*(uint *)(local_28 + 0x378),0xfffffffe,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x19a);
      fflush(_stderr);
      nn_err_abort();
    }
    break;
  case 4:
    if (in_ESI == 0xfffffffe) {
      if (in_EDX == 2) {
        nn_timer_stop((nn_timer *)0x13e87d);
        *(undefined8 *)(local_28 + 0x538) = 0;
        *(undefined4 *)(local_28 + 0x378) = 7;
      }
      else if (in_EDX == 4) {
        nn_timer_stop((nn_timer *)0x13e8b9);
        *(undefined8 *)(local_28 + 0x538) = 0;
        *(undefined4 *)(local_28 + 0x378) = 6;
      }
      else {
        if (in_EDX != 6) {
          nn_backtrace_print();
          fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                  (ulong)*(uint *)(local_28 + 0x378),0xfffffffe,(ulong)in_EDX,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                  ,0x1c4);
          fflush(_stderr);
          nn_err_abort();
        }
        nn_timer_stop((nn_timer *)0x13e8f5);
        *(undefined8 *)(local_28 + 0x538) = 0;
        *(undefined4 *)(local_28 + 0x378) = 5;
      }
    }
    else {
      if (in_ESI != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x1d3);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x378),1,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x1cf);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_timer_stop((nn_timer *)0x13e99e);
      *(undefined8 *)(local_28 + 0x538) = 0;
      *(undefined4 *)(local_28 + 0x378) = 5;
    }
    break;
  case 5:
    if (in_ESI == 0xfffffffe) {
      if (in_EDX != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x378),0xfffffffe,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x1ed);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(local_28 + 0x378) = 6;
    }
    else {
      if (in_ESI != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x1f1);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x378),1,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x1e4);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_req_action_send(in_stack_00000010,in_stack_0000000c);
    }
    break;
  case 6:
    if (in_ESI == 0xfffffffe) {
      if (in_EDX != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x378),0xfffffffe,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x213);
        fflush(_stderr);
        nn_err_abort();
      }
    }
    else {
      if (in_ESI != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x217);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x378),1,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x206);
        fflush(_stderr);
        nn_err_abort();
      }
      nn_req_action_send(in_stack_00000010,in_stack_0000000c);
    }
    break;
  case 7:
    if (in_ESI == 0xfffffffe) {
      if (in_EDX != 4) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x378),0xfffffffe,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x231);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(local_28 + 0x378) = 6;
    }
    else {
      if (in_ESI != 1) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
                (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x235);
        fflush(_stderr);
        nn_err_abort();
      }
      if (in_EDX != 2) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x378),1,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x228);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(local_28 + 0x378) = 8;
    }
    break;
  case 8:
    if (in_ESI != 0xfffffffe) {
      nn_backtrace_print();
      fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected source",
              (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
              "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
              ,0x24c);
      fflush(_stderr);
      nn_err_abort();
    }
    if (in_EDX == 4) {
      nn_req_action_send(in_stack_00000010,in_stack_0000000c);
    }
    else {
      if (in_EDX != 5) {
        nn_backtrace_print();
        fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected action",
                (ulong)*(uint *)(local_28 + 0x378),0xfffffffe,(ulong)in_EDX,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
                ,0x248);
        fflush(_stderr);
        nn_err_abort();
      }
      *(undefined4 *)(local_28 + 0x378) = 2;
    }
    break;
  default:
    nn_backtrace_print();
    fprintf(_stderr,"%s: state=%d source=%d action=%d (%s:%d)\n","Unexpected state",
            (ulong)*(uint *)(local_28 + 0x378),(ulong)in_ESI,(ulong)in_EDX,
            "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/req.c"
            ,0x253);
    fflush(_stderr);
    nn_err_abort();
  }
  return;
}

Assistant:

void nn_req_handler (struct nn_fsm *self, int src, int type,
    NN_UNUSED void *srcptr)
{
    struct nn_req *req;

    req = nn_cont (self, struct nn_req, fsm);

    switch (req->state) {

/******************************************************************************/
/*  IDLE state.                                                               */
/*  The socket was created recently. Intermediate state.                      */
/*  Pass straight to the PASSIVE state.                                       */
/******************************************************************************/
    case NN_REQ_STATE_IDLE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_FSM_START:
                req->state = NN_REQ_STATE_PASSIVE;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  PASSIVE state.                                                            */
/*  No request is submitted.                                                  */
/******************************************************************************/
    case NN_REQ_STATE_PASSIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                nn_req_action_send (req, 1);
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  DELAYED state.                                                            */
/*  Request was submitted but it could not be sent to the network because     */
/*  there was no peer available at the moment. Now we are waiting for the     */
/*  peer to arrive to send the request to it.                                 */
/******************************************************************************/
    case NN_REQ_STATE_DELAYED:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_OUT:
                nn_req_action_send (req, 0);
                return;
            case NN_REQ_ACTION_SENT:
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  ACTIVE state.                                                             */
/*  Request was submitted. Waiting for reply.                                 */
/******************************************************************************/
    case NN_REQ_STATE_ACTIVE:
        switch (src) {

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_IN:

                /*  Reply arrived. */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_STOPPING_TIMER;
                return;

            case NN_REQ_ACTION_SENT:

                /*  New request was sent while the old one was still being
                    processed. Cancel the old request first. */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_CANCELLING;
                return;

            case NN_REQ_ACTION_PIPE_RM:
                /*  Pipe that we sent request to is removed  */
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                /*  Pretend we timed out so request resent immediately  */
                req->state = NN_REQ_STATE_TIMED_OUT;
                return;

            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_TIMEOUT:
                nn_timer_stop (&req->task.timer);
                req->task.sent_to = NULL;
                req->state = NN_REQ_STATE_TIMED_OUT;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  TIMED_OUT state.                                                          */
/*  Waiting for reply has timed out. Stopping the timer. Afterwards, we'll    */
/*  re-send the request.                                                      */
/******************************************************************************/
    case NN_REQ_STATE_TIMED_OUT:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:
                nn_req_action_send (req, 1);
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                req->state = NN_REQ_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  CANCELLING state.                                                         */
/*  Request was canceled. Waiting till the timer is stopped. Note that        */
/*  cancelling is done by sending a new request. Thus there's already         */
/*  a request waiting to be sent in this state.                               */
/******************************************************************************/
    case NN_REQ_STATE_CANCELLING:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:
            switch (type) {
            case NN_TIMER_STOPPED:

                /*  Timer is stopped. Now we can send the delayed request. */
                nn_req_action_send (req, 1);
                return;

            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
             switch (type) {
             case NN_REQ_ACTION_SENT:

                 /*  No need to do anything here. Old delayed request is just
                     replaced by the new one that will be sent once the timer
                     is closed. */
                 return;

             default:
                 nn_fsm_bad_action (req->state, src, type);
             }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  STOPPING_TIMER state.                                                     */
/*  Reply was delivered. Waiting till the timer is stopped.                   */
/******************************************************************************/
    case NN_REQ_STATE_STOPPING_TIMER:
        switch (src) {

        case NN_REQ_SRC_RESEND_TIMER:

            switch (type) {
            case NN_TIMER_STOPPED:
                req->state = NN_REQ_STATE_DONE;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        case NN_FSM_ACTION:
            switch (type) {
            case NN_REQ_ACTION_SENT:
                req->state = NN_REQ_STATE_CANCELLING;
                return;
            default:
                nn_fsm_bad_action (req->state, src, type);
            }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  DONE state.                                                               */
/*  Reply was received but not yet retrieved by the user.                     */
/******************************************************************************/
    case NN_REQ_STATE_DONE:
        switch (src) {

        case NN_FSM_ACTION:
             switch (type) {
             case NN_REQ_ACTION_RECEIVED:
                 req->state = NN_REQ_STATE_PASSIVE;
                 return;
             case NN_REQ_ACTION_SENT:
                 nn_req_action_send (req, 1);
                 return;
             default:
                 nn_fsm_bad_action (req->state, src, type);
             }

        default:
            nn_fsm_bad_source (req->state, src, type);
        }

/******************************************************************************/
/*  Invalid state.                                                            */
/******************************************************************************/
    default:
        nn_fsm_bad_state (req->state, src, type);
    }
}